

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

Expression * __thiscall
soul::StructuralParser::parseExpression(StructuralParser *this,bool allowAssignment)

{
  char cVar1;
  char *__s1;
  bool bVar2;
  int iVar3;
  Assignment *args_1;
  Expression *pEVar4;
  Op opType;
  Context context;
  CompileMessage local_60;
  
  args_1 = (Assignment *)parseTernaryOperator(this);
  __s1 = (this->super_SOULTokeniser).currentType.text;
  if (__s1 == "+=") {
LAB_001d3adf:
    opType = add;
    goto LAB_001d3ea0;
  }
  if (__s1 == (char *)0x0) goto LAB_001d3db1;
  cVar1 = *__s1;
  if (cVar1 == '+') {
    if ((__s1[1] == '=') && (__s1[2] == '\0')) goto LAB_001d3adf;
    if (__s1 != "-=") {
LAB_001d3b1e:
      if (__s1 == "*=") {
LAB_001d3b9c:
        opType = multiply;
      }
      else {
        if ((cVar1 == '*') && (__s1[1] == '=')) {
          if (__s1[2] == '\0') goto LAB_001d3b9c;
          if (__s1 != "/=") {
LAB_001d3bb0:
            if ((__s1 == "%=") || (((cVar1 == '%' && (__s1[1] == '=')) && (__s1[2] == '\0')))) {
LAB_001d3c9e:
              opType = modulo;
              goto LAB_001d3ea0;
            }
LAB_001d3bd8:
            if ((__s1 == "<<=") || (iVar3 = strcmp(__s1,"<<="), iVar3 == 0)) {
              opType = leftShift;
              goto LAB_001d3ea0;
            }
            if ((__s1 == ">>=") || (iVar3 = strcmp(__s1,">>="), iVar3 == 0)) {
              opType = rightShift;
              goto LAB_001d3ea0;
            }
            if ((__s1 == ">>>=") || (iVar3 = strcmp(__s1,">>>="), iVar3 == 0)) {
              opType = rightShiftUnsigned;
              goto LAB_001d3ea0;
            }
            if (__s1 == "^=") {
LAB_001d3cee:
              opType = bitwiseXor;
            }
            else {
              if (cVar1 == '^') {
                if ((__s1[1] == '=') && (__s1[2] == '\0')) goto LAB_001d3cee;
                if (__s1 != "&=") {
LAB_001d3d3b:
                  if ((__s1 == "|=") || (((cVar1 == '|' && (__s1[1] == '=')) && (__s1[2] == '\0'))))
                  {
LAB_001d3e6f:
                    opType = bitwiseOr;
                    goto LAB_001d3ea0;
                  }
LAB_001d3d63:
                  if ((__s1 == "&&=") || (iVar3 = strcmp(__s1,"&&="), iVar3 == 0)) {
                    opType = logicalAnd;
                  }
                  else {
                    if ((__s1 != "||=") && (iVar3 = strcmp(__s1,"||="), iVar3 != 0)) {
LAB_001d3db1:
                      bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                              ::matchIf<soul::TokenType>
                                        (&this->super_SOULTokeniser,(TokenType)0x259fb3);
                      if (bVar2) {
                        if (!allowAssignment) {
                          CompileMessageHelpers::createMessage<>
                                    (&local_60,syntax,error,
                                     "Assignment is not allowed inside an expression");
                          (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this);
                          CompileMessage::~CompileMessage(&local_60);
                        }
                        local_60.description._M_dataplus._M_p =
                             (pointer)(this->super_SOULTokeniser).location.sourceCode.object;
                        if ((SourceCodeText *)local_60.description._M_dataplus._M_p !=
                            (SourceCodeText *)0x0) {
                          (((SourceCodeText *)local_60.description._M_dataplus._M_p)->
                          super_RefCountedObject).refCount =
                               (((SourceCodeText *)local_60.description._M_dataplus._M_p)->
                               super_RefCountedObject).refCount + 1;
                        }
                        local_60.description._M_string_length =
                             (size_type)(this->super_SOULTokeniser).location.location.data;
                        local_60.description.field_2._M_allocated_capacity =
                             (size_type)this->currentScope;
                        pEVar4 = parseExpression(this,false);
                        args_1 = PoolAllocator::
                                 allocate<soul::AST::Assignment,soul::AST::Context&,soul::AST::Expression&,soul::AST::Expression&>
                                           (&this->allocator->pool,(Context *)&local_60,
                                            (Expression *)args_1,pEVar4);
                        RefCountedPtr<soul::SourceCodeText>::decIfNotNull
                                  ((SourceCodeText *)local_60.description._M_dataplus._M_p);
                      }
                      return &args_1->super_Expression;
                    }
                    opType = logicalOr;
                  }
                  goto LAB_001d3ea0;
                }
              }
              else if (__s1 != "&=") {
                if ((cVar1 != '&') || (__s1[1] != '=')) goto LAB_001d3d3b;
                if (__s1[2] != '\0') {
                  if (__s1 == "|=") goto LAB_001d3e6f;
                  goto LAB_001d3d63;
                }
              }
              opType = bitwiseAnd;
            }
            goto LAB_001d3ea0;
          }
        }
        else {
LAB_001d3b63:
          if (__s1 != "/=") {
            if ((cVar1 != '/') || (__s1[1] != '=')) goto LAB_001d3bb0;
            if (__s1[2] != '\0') {
              if (__s1 == "%=") goto LAB_001d3c9e;
              goto LAB_001d3bd8;
            }
          }
        }
        opType = divide;
      }
      goto LAB_001d3ea0;
    }
  }
  else if (__s1 != "-=") {
    if ((cVar1 != '-') || (__s1[1] != '=')) goto LAB_001d3b1e;
    if (__s1[2] != '\0') {
      if (__s1 != "*=") goto LAB_001d3b63;
      goto LAB_001d3b9c;
    }
  }
  opType = subtract;
LAB_001d3ea0:
  pEVar4 = parseInPlaceOpExpression(this,allowAssignment,(Expression *)args_1,opType);
  return pEVar4;
}

Assistant:

AST::Expression& parseExpression (bool allowAssignment = false)
    {
        auto& lhs = parseTernaryOperator();

        if (matches (Operator::plusEquals))                 return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::add);
        if (matches (Operator::minusEquals))                return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::subtract);
        if (matches (Operator::timesEquals))                return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::multiply);
        if (matches (Operator::divideEquals))               return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::divide);
        if (matches (Operator::moduloEquals))               return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::modulo);
        if (matches (Operator::leftShiftEquals))            return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::leftShift);
        if (matches (Operator::rightShiftEquals))           return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::rightShift);
        if (matches (Operator::rightShiftUnsignedEquals))   return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::rightShiftUnsigned);
        if (matches (Operator::xorEquals))                  return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::bitwiseXor);
        if (matches (Operator::bitwiseAndEquals))           return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::bitwiseAnd);
        if (matches (Operator::bitwiseOrEquals))            return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::bitwiseOr);
        if (matches (Operator::logicalAndEquals))           return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::logicalAnd);
        if (matches (Operator::logicalOrEquals))            return parseInPlaceOpExpression (allowAssignment, lhs, BinaryOp::Op::logicalOr);

        if (matchIf (Operator::assign))
        {
            if (! allowAssignment)
                throwError (Errors::assignmentInsideExpression());

            auto context = getContext();
            return allocate<AST::Assignment> (context, lhs, parseExpression());
        }

        return lhs;
    }